

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::start(UdpSocket *this)

{
  Channel *this_00;
  undefined1 local_78 [16];
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Liby::UdpSocket,void>
            ((__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2> *)local_78,
             (__weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  this_00 = (this->chan_)._M_t.
            super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
            super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
            super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:129:19)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:129:19)>
             ::_M_manager;
  local_78._0_8_ = this;
  std::function<void_()>::operator=(&this_00->readEventCallback_,(function<void_()> *)local_78);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:130:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:130:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_00->writEventCallback_,(function<void_()> *)&local_38);
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:131:17)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:131:17)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_00->erroEventCallback_,(function<void_()> *)&local_58);
  this_00->readable_ = true;
  Channel::addChannel(this_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  return;
}

Assistant:

void UdpSocket::start() {
    self_ = shared_from_this();
    chan_->onRead([this] { handleReadEvent(); })
        .onWrit([this] { handleWritEvent(); })
        .onErro([this] { handleErroEvent(); })
        .enableRead()
        .addChannel();
}